

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O0

void __thiscall
sisl::utility::isosurface::processFaces
          (isosurface *this,
          map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          *vMap,vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                *faces)

{
  int j;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Tuple_impl<1UL,_int,_int> *p_Var4;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *__k;
  mapped_type *pmVar5;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *__k_00;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *__k_01;
  int i3;
  int i2;
  int i1;
  tuple<int,_int,_int> t;
  __normal_iterator<const_std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  local_98;
  const_iterator itr_1;
  int vIndex;
  undefined1 local_80 [8];
  vertex3 v;
  _Self local_58;
  iterator itr;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> faceMap;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *faces_local;
  map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
  *vMap_local;
  isosurface *this_local;
  
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&itr);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
       ::begin(vMap);
  while( true ) {
    v.n.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)std::
                map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
                ::end(vMap);
    bVar1 = std::operator!=(&local_58,
                            (_Self *)&v.n.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_sisl::vertex3>_>::operator->(&local_58);
    vertex3::vertex3((vertex3 *)local_80,&ppVar3->second);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_sisl::vertex3>_>::operator->(&local_58);
    itr_1._M_current._0_4_ = ppVar3->first;
    iVar2 = ply_mesh::add_vertex(&this->plyfile,(vertex3 *)local_80);
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&itr,(key_type *)&itr_1);
    *pmVar5 = iVar2;
    vertex3::~vertex3((vertex3 *)local_80);
    std::_Rb_tree_iterator<std::pair<const_int,_sisl::vertex3>_>::operator++(&local_58);
  }
  local_98._M_current =
       (tuple<int,_int,_int> *)
       std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::begin
                 (faces);
  while( true ) {
    register0x00000000 =
         std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::end
                   (faces);
    bVar1 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<const_std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                        *)&t.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>
                      );
    if (!bVar1) break;
    p_Var4 = (_Tuple_impl<1UL,_int,_int> *)
             __gnu_cxx::
             __normal_iterator<const_std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
             ::operator*(&local_98);
    t.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
    super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (_Head_base<2UL,_int,_false>)
         p_Var4[1].super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    _i2 = *p_Var4;
    __k = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)&i2);
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&itr,__k);
    iVar2 = *pmVar5;
    __k_00 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)&i2);
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&itr,__k_00);
    j = *pmVar5;
    __k_01 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)&i2);
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&itr,__k_01);
    ply_mesh::add_triangle(&this->plyfile,iVar2,j,*pmVar5);
    __gnu_cxx::
    __normal_iterator<const_std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
    ::operator++(&local_98);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&itr);
  return;
}

Assistant:

void processFaces(
            std::map<int, sisl::vertex3 > *vMap,
            const std::vector<std::tuple<int,int,int>> &faces){
         std::map<int, int> faceMap;

        for(auto itr = vMap->begin(); itr != vMap->end(); ++itr) {
            sisl::vertex3 v = itr->second;
            int vIndex = itr->first;

            faceMap[vIndex] = plyfile.add_vertex(v);
        }

        for(auto itr = faces.begin(); itr != faces.end(); ++itr) {
            std::tuple<int, int, int> t = *itr;

            int i1 = faceMap[std::get<0>(t)];
            int i2 = faceMap[std::get<1>(t)];
            int i3 = faceMap[std::get<2>(t)];

            plyfile.add_triangle(i1,i2,i3);
        }
    }